

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

char * __thiscall cmGeneratorTarget::GetExportMacro(cmGeneratorTarget *this)

{
  bool bVar1;
  char *pcVar2;
  string in;
  string local_50;
  string local_30;
  
  if (((this->Target->TargetTypeValue & ~STATIC_LIBRARY) != SHARED_LIBRARY) &&
     (bVar1 = IsExecutableWithExports(this), !bVar1)) {
    return (char *)0x0;
  }
  std::__cxx11::string::string((string *)&local_50,"DEFINE_SYMBOL",(allocator *)&local_30);
  pcVar2 = GetProperty(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_50,(string *)&this->Target->Name);
    std::__cxx11::string::append((char *)&local_50);
    cmsys::SystemTools::MakeCidentifier(&local_30,&local_50);
    std::__cxx11::string::operator=((string *)&this->ExportMacro,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::__cxx11::string::assign((char *)&this->ExportMacro);
  }
  return (this->ExportMacro)._M_dataplus._M_p;
}

Assistant:

const char* cmGeneratorTarget::GetExportMacro() const
{
  // Define the symbol for targets that export symbols.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
      this->GetType() == cmStateEnums::MODULE_LIBRARY ||
      this->IsExecutableWithExports()) {
    if (const char* custom_export_name = this->GetProperty("DEFINE_SYMBOL")) {
      this->ExportMacro = custom_export_name;
    } else {
      std::string in = this->GetName();
      in += "_EXPORTS";
      this->ExportMacro = cmSystemTools::MakeCidentifier(in);
    }
    return this->ExportMacro.c_str();
  }
  return CM_NULLPTR;
}